

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall ftxui::Renderer::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  ~Impl(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

Component Renderer(std::function<Element()> render) {
  class Impl : public ComponentBase {
   public:
    Impl(std::function<Element()> render) : render_(std::move(render)) {}
    Element Render() override { return render_(); }
    std::function<Element()> render_;
  };

  return Make<Impl>(std::move(render));
}